

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdoc.c
# Opt level: O0

void prvTidyCleanGoogleDocument(TidyDocImpl *doc)

{
  TidyDocImpl *doc_local;
  
  CleanNode(doc,&doc->root);
  SetUTF8(doc);
  return;
}

Assistant:

void TY_(CleanGoogleDocument)( TidyDocImpl* doc )
{
    /* placeholder.  CleanTree()/CleanNode() will not
    ** zap root element 
    */
    CleanNode( doc, &doc->root );
    SetUTF8( doc );
}